

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_25_25_read_line_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res0;
  sexp_conflict res;
  char *tmp0;
  char *err;
  int local_88;
  int local_80;
  long local_70;
  long local_68;
  sexp_conflict *local_60;
  undefined8 local_58;
  sexp_conflict local_50;
  sexp_conflict local_48;
  char *local_40;
  char *local_38;
  int *local_30;
  int *local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_50 = (sexp_conflict)&DAT_0000043e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_60,0,0x10);
  if ((((ulong)local_28 & 1) == 1) || ((((ulong)local_28 & 3) == 0 && (*local_28 == 0xc)))) {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 0x10)) {
      if (*(long *)(local_30 + 8) == 0) {
        local_8 = (sexp_conflict)
                  sexp_xtype_exception(local_10,local_18,"not a FILE* backed port",local_30);
      }
      else {
        iVar3 = sexp_maybe_block_port(local_10,local_30,0);
        if (iVar3 == 0) {
          local_60 = &local_50;
          local_58 = *(undefined8 *)(local_10 + 0x6080);
          *(sexp_conflict ***)(local_10 + 0x6080) = &local_60;
          if (((ulong)local_28 & 1) == 1) {
            auVar1._8_8_ = (long)local_28 >> 0x3f;
            auVar1._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
            local_68 = SUB168(auVar1 / SEXT816(2),0);
          }
          else {
            if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xc)) {
              local_70 = *(long *)(local_28 + 6);
            }
            else {
              local_70 = 0;
            }
            local_68 = local_70;
          }
          local_40 = (char *)calloc(1,local_68 + 1);
          if (((ulong)local_28 & 1) == 1) {
            auVar2._8_8_ = (long)local_28 >> 0x3f;
            auVar2._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
            local_80 = SUB164(auVar2 / SEXT816(2),0);
          }
          else {
            if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xc)) {
              local_88 = (int)(char)local_28[2] * (int)*(undefined8 *)(local_28 + 6);
            }
            else {
              local_88 = 0;
            }
            local_80 = local_88;
          }
          local_38 = fgets(local_40,local_80,*(FILE **)(local_30 + 8));
          if (local_38 == (char *)0x0) {
            local_48 = (sexp_conflict)0x3e;
          }
          else {
            local_50 = (sexp_conflict)sexp_c_string(local_10,local_40,0xffffffffffffffff);
            local_48 = local_50;
          }
          free(local_40);
          sexp_maybe_unblock_port(local_10,local_30);
          *(undefined8 *)(local_10 + 0x6080) = local_58;
          local_8 = local_48;
        }
        else {
          local_8 = *(sexp_conflict *)(*(long *)(local_10 + 0x28) + 0x140);
        }
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0x10,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_25_25_read_line_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2) {
  char *err;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_iportp(arg2))
    return sexp_type_exception(ctx, self, SEXP_IPORT, arg2);
  if (!sexp_stream_portp(arg2))
    return sexp_xtype_exception(ctx, self, "not a FILE* backed port", arg2);
  sexp_check_block_port(ctx, arg2, 0);
  sexp_gc_preserve1(ctx, res0);
  tmp0 = (char*) calloc(1, 1 + sexp_uint_value(arg1)*sizeof(tmp0[0]));
  err = fgets(tmp0, sexp_sint_value(arg1), sexp_port_stream(arg2));
  if (!err) {
  res = SEXP_FALSE;
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  free(tmp0);
  sexp_maybe_unblock_port(ctx, arg2);
  sexp_gc_release1(ctx);
  return res;
}